

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-internal.h
# Opt level: O0

void testing::internal::
     GenerateNamesRecursively<testing::internal::DefaultNameGenerator,testing::internal::Types<std::pair<char8_t,char>,std::pair<char8_t,char8_t>,std::pair<char8_t,char16_t>,std::pair<char8_t,char32_t>,std::pair<char16_t,char>,std::pair<char16_t,char8_t>,std::pair<char16_t,char16_t>,std::pair<char16_t,char32_t>,std::pair<char32_t,char>,std::pair<char32_t,char8_t>,std::pair<char32_t,char16_t>,std::pair<char32_t,char32_t>>>
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *param_1,uint param_2,int param_3)

{
  string local_40;
  uint local_1c;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvStack_18;
  int i_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *result_local;
  
  local_1c = param_2;
  pvStack_18 = param_1;
  DefaultNameGenerator::GetName<std::pair<char8_t,char>>
            (&local_40,(DefaultNameGenerator *)(ulong)param_2,param_3);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(param_1,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  GenerateNamesRecursively<testing::internal::DefaultNameGenerator,testing::internal::Types<std::pair<char8_t,char8_t>,std::pair<char8_t,char16_t>,std::pair<char8_t,char32_t>,std::pair<char16_t,char>,std::pair<char16_t,char8_t>,std::pair<char16_t,char16_t>,std::pair<char16_t,char32_t>,std::pair<char32_t,char>,std::pair<char32_t,char8_t>,std::pair<char32_t,char16_t>,std::pair<char32_t,char32_t>>>
            (pvStack_18,local_1c + 1);
  return;
}

Assistant:

void GenerateNamesRecursively(Types, std::vector<std::string>* result, int i) {
  result->push_back(NameGenerator::template GetName<typename Types::Head>(i));
  GenerateNamesRecursively<NameGenerator>(typename Types::Tail(), result,
                                          i + 1);
}